

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidget::QDockWidget(QDockWidget *this,QWidget *parent,WindowFlags flags)

{
  long lVar1;
  EVP_PKEY_CTX *ctx;
  QDockWidgetPrivate *pQVar2;
  QWidget *in_RSI;
  QDockWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetPrivate *d;
  QWidgetPrivate *in_stack_ffffffffffffffd8;
  QFlagsStorage<Qt::WindowType> f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  ctx = (EVP_PKEY_CTX *)operator_new(0x2c8);
  f.i = (Int)((ulong)pQVar2 >> 0x20);
  QDockWidgetPrivate::QDockWidgetPrivate(in_RDI);
  QWidget::QWidget(in_RSI,in_stack_ffffffffffffffd8,(QWidget *)in_RDI,(WindowFlags)f.i);
  *(undefined ***)&in_RDI->super_QWidgetPrivate = &PTR_metaObject_00d13270;
  *(undefined ***)&(in_RDI->super_QWidgetPrivate).field_0x10 = &PTR__QDockWidget_00d13428;
  pQVar2 = d_func((QDockWidget *)0x58f128);
  QDockWidgetPrivate::init(pQVar2,ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDockWidget::QDockWidget(QWidget *parent, Qt::WindowFlags flags)
    : QWidget(*new QDockWidgetPrivate, parent, flags)
{
    Q_D(QDockWidget);
    d->init();
}